

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
* __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getInterfaceConn
          (PortConnectionBuilder *this,ASTContext *context,InterfacePortSymbol *port,
          ExpressionSyntax *syntax)

{
  span<const_slang::ConstantRange,_18446744073709551615UL> right;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  SourceRange sourceRange;
  span<const_slang::ConstantRange,_18446744073709551615UL> left;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  DeferredSourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint uVar4;
  VirtualInterfaceType *pVVar5;
  DefinitionSymbol *pDVar6;
  ModportSymbol *pMVar7;
  size_type sVar8;
  size_type sVar9;
  InstanceArraySymbol *pIVar10;
  reference peVar11;
  reference this_00;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  InterfacePortSymbol *in_RSI;
  SourceLocation in_RDI;
  SourceRange SVar12;
  Diagnostic *diag;
  size_t index;
  InstanceArraySymbol *array;
  size_t i;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimSpan;
  Symbol *symbol;
  anon_class_40_5_9960d2bb makeResult;
  ModportSymbol *sym;
  Diagnostic *diag_2;
  ModportSymbol *modport;
  Diagnostic *diag_1;
  DefinitionSymbol *connDef;
  VirtualInterfaceType *vit;
  not_null<const_slang::ast::Type_*> type;
  SmallVector<slang::ConstantRange,_4UL> dims;
  Expression *expr;
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> portDims;
  anon_class_1_0_00000001 makeError;
  undefined1 in_stack_000006ff;
  ExpressionSyntax *in_stack_00000700;
  ASTContext *in_stack_00000708;
  Type *in_stack_fffffffffffffbc8;
  Diagnostic *in_stack_fffffffffffffbd0;
  SourceLocation in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  DiagCode in_stack_fffffffffffffbe4;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffbe8;
  SourceLocation in_stack_fffffffffffffbf0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 uVar13;
  DiagCode in_stack_fffffffffffffc04;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffc10;
  undefined2 in_stack_fffffffffffffc14;
  undefined1 in_stack_fffffffffffffc16;
  undefined1 in_stack_fffffffffffffc17;
  size_t in_stack_fffffffffffffc18;
  SyntaxNode *in_stack_fffffffffffffc20;
  Symbol *in_stack_fffffffffffffc38;
  InterfacePortSymbol *symbol_00;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  InstanceSymbol *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  InterfacePortSymbol *in_stack_fffffffffffffc58;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> PVar15;
  undefined7 in_stack_fffffffffffffd08;
  SourceLocation SVar16;
  DiagCode code;
  size_type local_290;
  ulong local_280;
  Diagnostic *pDStack_1d0;
  SourceLocation local_1c8;
  Type *local_b0;
  not_null<const_slang::ast::Type_*> local_a8;
  ConstantRange local_9c;
  Expression *local_48;
  undefined1 local_21;
  SourceLocation local_18;
  SourceLocation local_10;
  
  local_21 = 0;
  SVar16 = in_RDI;
  local_18 = in_RCX;
  local_10 = in_RDX;
  InterfacePortSymbol::getDeclaredRange(in_RSI);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                     0x6c9e08);
  if (!bVar1) {
    getInterfaceConn::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    return (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
            *)SVar16;
  }
  local_48 = Expression::tryBindInterfaceRef
                       (in_stack_00000708,in_stack_00000700,(bool)in_stack_000006ff);
  if ((local_48 == (Expression *)0x0) ||
     (bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffbd0), bVar1)) {
    getInterfaceConn::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    return (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
            *)SVar16;
  }
  SmallVector<slang::ConstantRange,_4UL>::SmallVector
            ((SmallVector<slang::ConstantRange,_4UL> *)0x6c9e8d);
  not_null<const_slang::ast::Type_*>::not_null<slang::not_null<const_slang::ast::Type_*>_&>
            ((not_null<const_slang::ast::Type_*> *)in_stack_fffffffffffffbd0,
             (not_null<const_slang::ast::Type_*> *)in_stack_fffffffffffffbc8);
  while( true ) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6c9eb7);
    uVar2 = Type::isUnpackedArray(in_stack_fffffffffffffbc8);
    if (!(bool)uVar2) break;
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6c9ee5);
    local_9c = Type::getFixedRange(in_stack_fffffffffffffbc8);
    SmallVectorBase<slang::ConstantRange>::push_back
              ((SmallVectorBase<slang::ConstantRange> *)in_stack_fffffffffffffbd0,
               (ConstantRange *)in_stack_fffffffffffffbc8);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6c9f2b);
    local_b0 = Type::getArrayElementType((Type *)in_stack_fffffffffffffbd8);
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_a8,&local_b0);
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x6c9f9f);
  pVVar5 = Symbol::as<slang::ast::VirtualInterfaceType>((Symbol *)0x6c9fa7);
  pDVar6 = InstanceSymbol::getDefinition((InstanceSymbol *)0x6c9fd2);
  if ((pDVar6 != *(DefinitionSymbol **)((long)local_18 + 0x40)) &&
     ((*(byte *)((long)local_18 + 0x58) & 1) == 0)) {
    slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc20);
    sourceRange.endLoc = (SourceLocation)in_stack_fffffffffffffbf8._M_extent_value;
    sourceRange.startLoc = in_stack_fffffffffffffbf0;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffbe8._M_extent_value,
                        in_stack_fffffffffffffc04,sourceRange);
    Symbol::getHierarchicalPath_abi_cxx11_((Symbol *)in_stack_fffffffffffffbf8._M_extent_value);
    Diagnostic::operator<<(in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8);
    arg._M_str = (char *)in_stack_fffffffffffffc20;
    arg._M_len = in_stack_fffffffffffffc18;
    Diagnostic::operator<<
              ((Diagnostic *)
               CONCAT17(in_stack_fffffffffffffc17,
                        CONCAT16(in_stack_fffffffffffffc16,
                                 CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),arg
              );
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0);
    Diagnostic::addNote(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbe4,
                        in_stack_fffffffffffffbd8);
    getInterfaceConn::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    goto LAB_006caa65;
  }
  pMVar7 = pVVar5->modport;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)local_18 + 0x48));
  if (!bVar1) {
    if ((pMVar7 != (ModportSymbol *)0x0) &&
       (__x._M_str._0_4_ = in_stack_fffffffffffffc00,
       __x._M_len = in_stack_fffffffffffffbf8._M_extent_value,
       __x._M_str._4_4_ = in_stack_fffffffffffffc04, __y._M_str = (char *)in_stack_fffffffffffffbf0,
       __y._M_len = in_stack_fffffffffffffbe8._M_extent_value, bVar1 = std::operator==(__x,__y),
       ((bVar1 ^ 0xffU) & 1) != 0)) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc20);
      SVar12.endLoc = (SourceLocation)in_stack_fffffffffffffbf8._M_extent_value;
      SVar12.startLoc = in_stack_fffffffffffffbf0;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffbe8._M_extent_value,
                          in_stack_fffffffffffffc04,SVar12);
      arg_00._M_str = (char *)in_stack_fffffffffffffc20;
      arg_00._M_len = in_stack_fffffffffffffc18;
      Diagnostic::operator<<
                ((Diagnostic *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
                 arg_00);
      arg_01._M_str = (char *)in_stack_fffffffffffffc20;
      arg_01._M_len = in_stack_fffffffffffffc18;
      Diagnostic::operator<<
                ((Diagnostic *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
                 arg_01);
      if ((*(byte *)((long)local_18 + 0x58) & 1) != 0) {
        sv((char *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
      }
      arg_02._M_str = (char *)in_stack_fffffffffffffc20;
      arg_02._M_len = in_stack_fffffffffffffc18;
      Diagnostic::operator<<
                ((Diagnostic *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
                 arg_02);
      arg_03._M_str = (char *)in_stack_fffffffffffffc20;
      arg_03._M_len = in_stack_fffffffffffffc18;
      Diagnostic::operator<<
                ((Diagnostic *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
                 arg_03);
      getInterfaceConn::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      goto LAB_006caa65;
    }
    PVar15.value = (uintptr_t)pVVar5->iface;
    slang::syntax::DeferredSourceRange::DeferredSourceRange
              ((DeferredSourceRange *)in_stack_fffffffffffffbd0,
               (SyntaxNode *)in_stack_fffffffffffffbc8);
    sourceRange_00.range.endLoc = local_10;
    sourceRange_00.range.startLoc = local_18;
    sourceRange_00.node.value = PVar15.value;
    pMVar7 = InterfacePortSymbol::getModport
                       (in_stack_fffffffffffffc58,
                        (ASTContext *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                        in_stack_fffffffffffffc48,sourceRange_00);
    in_stack_fffffffffffffbd0 = pDStack_1d0;
    in_stack_fffffffffffffbd8 = local_1c8;
    if (pMVar7 == (ModportSymbol *)0x0) {
      getInterfaceConn::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      goto LAB_006caa65;
    }
  }
  Expression::as<slang::ast::ArbitrarySymbolExpression>(local_48);
  not_null::operator_cast_to_Symbol_((not_null<const_slang::ast::Symbol_*> *)0x6ca5b4);
  std::optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>::operator*
            ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)0x6ca5db);
  std::span<const_slang::ConstantRange,_18446744073709551615UL>::
  span<slang::SmallVector<slang::ConstantRange,_4UL>_&>
            ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             (SmallVector<slang::ConstantRange,_4UL> *)in_stack_fffffffffffffbd8);
  left._M_extent._M_extent_value = in_stack_fffffffffffffbf8._M_extent_value;
  left._M_ptr = (pointer)in_stack_fffffffffffffbf0;
  right._M_ptr._4_4_ = in_stack_fffffffffffffbe4;
  right._M_ptr._0_4_ = in_stack_fffffffffffffbe0;
  right._M_extent._M_extent_value = in_stack_fffffffffffffbe8._M_extent_value;
  bVar1 = areDimSizesEqual(left,right);
  if (bVar1) {
    getInterfaceConn::anon_class_40_5_9960d2bb::operator()
              ((anon_class_40_5_9960d2bb *)
               CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               in_stack_fffffffffffffc38);
  }
  else {
    std::span<const_slang::ConstantRange,_18446744073709551615UL>::
    span<slang::SmallVector<slang::ConstantRange,_4UL>_&>
              ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (SmallVector<slang::ConstantRange,_4UL> *)in_stack_fffffffffffffbd8);
    sVar8 = std::span<const_slang::ConstantRange,_18446744073709551615UL>::size
                      ((span<const_slang::ConstantRange,_18446744073709551615UL> *)0x6ca687);
    sVar9 = SmallVectorBase<slang::ConstantRange>::size
                      ((SmallVectorBase<slang::ConstantRange> *)(in_RSI + 4));
    if (sVar9 <= sVar8) {
      symbol_00 = in_RSI + 4;
      SmallVectorBase<slang::ConstantRange>::size
                ((SmallVectorBase<slang::ConstantRange> *)symbol_00);
      std::span<const_slang::ConstantRange,_18446744073709551615UL>::subspan
                ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (size_type)in_stack_fffffffffffffbd8,(size_type)in_stack_fffffffffffffbd0);
      std::span<const_slang::ConstantRange,_18446744073709551615UL>::
      span<slang::SmallVector<slang::ConstantRange,_4UL>_&>
                ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (SmallVector<slang::ConstantRange,_4UL> *)in_stack_fffffffffffffbd8);
      left_00._M_extent._M_extent_value = in_stack_fffffffffffffbf8._M_extent_value;
      left_00._M_ptr = (pointer)in_stack_fffffffffffffbf0;
      right_00._M_ptr._4_4_ = in_stack_fffffffffffffbe4;
      right_00._M_ptr._0_4_ = in_stack_fffffffffffffbe0;
      right_00._M_extent._M_extent_value = in_stack_fffffffffffffbe8._M_extent_value;
      uVar3 = areDimSizesEqual(left_00,right_00);
      if ((bool)uVar3) {
        SmallVectorBase<slang::ConstantRange>::size
                  ((SmallVectorBase<slang::ConstantRange> *)(in_RSI + 4));
        std::span<const_slang::ConstantRange,_18446744073709551615UL>::subspan
                  ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                   CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (size_type)in_stack_fffffffffffffbd8,(size_type)in_stack_fffffffffffffbd0);
        std::optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>::operator*
                  ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                   0x6ca786);
        left_01._M_extent._M_extent_value = in_stack_fffffffffffffbf8._M_extent_value;
        left_01._M_ptr = (pointer)in_stack_fffffffffffffbf0;
        right_01._M_ptr._4_4_ = in_stack_fffffffffffffbe4;
        right_01._M_ptr._0_4_ = in_stack_fffffffffffffbe0;
        right_01._M_extent._M_extent_value = in_stack_fffffffffffffbe8._M_extent_value;
        bVar1 = areDimSizesEqual(left_01,right_01);
        if (bVar1) {
          for (local_280 = 0;
              sVar8 = std::span<const_unsigned_int,_18446744073709551615UL>::size
                                ((span<const_unsigned_int,_18446744073709551615UL> *)0x6ca7f7),
              local_280 < sVar8; local_280 = local_280 + 1) {
            pIVar10 = Symbol::as<slang::ast::InstanceArraySymbol>((Symbol *)0x6ca815);
            peVar11 = std::span<const_unsigned_int,_18446744073709551615UL>::operator[]
                                ((span<const_unsigned_int,_18446744073709551615UL> *)
                                 ((in_RSI->super_Symbol).name._M_len + 0x40),local_280);
            local_290 = (size_type)*peVar11;
            this_00 = SmallVectorBase<slang::ConstantRange>::operator[]
                                ((SmallVectorBase<slang::ConstantRange> *)(in_RSI + 4),local_280);
            bVar1 = ConstantRange::isLittleEndian(this_00);
            uVar4 = (uint)bVar1;
            bVar1 = ConstantRange::isLittleEndian(&pIVar10->range);
            if (uVar4 != bVar1) {
              sVar8 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::size
                                ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                                 0x6ca8ce);
              local_290 = (sVar8 - local_290) - 1;
            }
            std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::operator[]
                      (&pIVar10->elements,local_290);
          }
          getInterfaceConn::anon_class_40_5_9960d2bb::operator()
                    ((anon_class_40_5_9960d2bb *)CONCAT17(uVar3,in_stack_fffffffffffffc40),
                     &symbol_00->super_Symbol);
          goto LAB_006caa65;
        }
      }
    }
    code = SUB84((ulong)in_RSI >> 0x20,0);
    SVar12 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc20);
    uVar13 = SVar12.endLoc._0_4_;
    uVar14 = SVar12.endLoc._4_4_;
    sourceRange_01.endLoc = SVar16;
    sourceRange_01.startLoc = in_RDI;
    Scope::addDiag((Scope *)CONCAT17(uVar2,in_stack_fffffffffffffd08),code,sourceRange_01);
    arg_04._M_str = (char *)in_stack_fffffffffffffc20;
    arg_04._M_len = in_stack_fffffffffffffc18;
    Diagnostic::operator<<
              ((Diagnostic *)
               CONCAT17(in_stack_fffffffffffffc17,
                        CONCAT16(in_stack_fffffffffffffc16,
                                 CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
               arg_04);
    Diagnostic::addNote(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbe4,
                        in_stack_fffffffffffffbd8);
    getInterfaceConn::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)CONCAT44(uVar14,uVar13));
  }
LAB_006caa65:
  SmallVector<slang::ConstantRange,_4UL>::~SmallVector
            ((SmallVector<slang::ConstantRange,_4UL> *)0x6caa72);
  return (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
          *)SVar16;
}

Assistant:

std::pair<PortConnection::IfaceConn, const Expression*> getInterfaceConn(
        ASTContext& context, const InterfacePortSymbol& port, const ExpressionSyntax& syntax) {
        SLANG_ASSERT(!port.isInvalid());

        auto makeError = []() -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{nullptr, nullptr}, nullptr};
        };

        auto portDims = port.getDeclaredRange();
        if (!portDims)
            return makeError();

        auto expr = Expression::tryBindInterfaceRef(context, syntax,
                                                    /* isInterfacePort */ true);
        if (!expr || expr->bad())
            return makeError();

        // Pull out the expression type, which should always be a virtual interface or
        // array of such types, and decompose into dims and interface info.
        SmallVector<ConstantRange, 4> dims;
        auto type = expr->type;
        while (type->isUnpackedArray()) {
            dims.push_back(type->getFixedRange());
            type = type->getArrayElementType();
        }

        auto& vit = type->as<VirtualInterfaceType>();
        auto& connDef = vit.iface.getDefinition();

        SLANG_ASSERT(vit.isRealIface);
        SLANG_ASSERT(port.isGeneric || port.interfaceDef);
        if (&connDef != port.interfaceDef && !port.isGeneric) {
            auto& diag = context.addDiag(diag::InterfacePortTypeMismatch, syntax.sourceRange());
            diag << connDef.getHierarchicalPath() << port.interfaceDef->name;
            diag.addNote(diag::NoteDeclarationHere, port.location);
            return makeError();
        }

        // Modport must match the specified requirement, if we have one.
        auto modport = vit.modport;
        if (!port.modport.empty()) {
            if (modport && modport->name != port.modport) {
                auto& diag = context.addDiag(diag::ModportConnMismatch, syntax.sourceRange());
                diag << connDef.name << modport->name;
                diag << (port.isGeneric ? "interface"sv : port.interfaceDef->name);
                diag << port.modport;
                return makeError();
            }

            auto sym = port.getModport(context, vit.iface, syntax);
            if (!sym)
                return makeError();

            modport = sym;
        }

        auto makeResult =
            [&](const Symbol* symbol) -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{rewireIfaceArrayIndices(symbol, port.name, port.location, *portDims), modport},
                    expr};
        };

        // Make the connection if the dimensions match exactly what the port is expecting.
        const Symbol* symbol = expr->as<ArbitrarySymbolExpression>().symbol;
        if (areDimSizesEqual(*portDims, dims))
            return makeResult(symbol);

        // Otherwise, if the instance being instantiated is part of an array of instances *and*
        // the symbol we're connecting to is an array of interfaces, we need to check to see whether
        // to slice up that array among all the instances. We do the slicing operation if:
        // instance array dimensions + port dimensions == connection dimensions
        std::span<const ConstantRange> dimSpan = dims;
        if (dimSpan.size() >= instanceDims.size() &&
            areDimSizesEqual(dimSpan.subspan(0, instanceDims.size()), instanceDims) &&
            areDimSizesEqual(dimSpan.subspan(instanceDims.size()), *portDims)) {

            // It's ok to do the slicing, so pick the correct slice for the connection
            // based on the actual path of the instance we're elaborating.
            for (size_t i = 0; i < instance.arrayPath.size(); i++) {
                // We want to match left index to left index, so if the dimensions
                // are in reversed order we need to reverse our index here.
                auto& array = symbol->as<InstanceArraySymbol>();
                size_t index = instance.arrayPath[i];
                if (instanceDims[i].isLittleEndian() != array.range.isLittleEndian())
                    index = array.elements.size() - index - 1;

                symbol = array.elements[index];
            }

            return makeResult(symbol);
        }

        auto& diag = scope.addDiag(diag::PortConnDimensionsMismatch, syntax.sourceRange())
                     << port.name;
        diag.addNote(diag::NoteDeclarationHere, port.location);
        return makeError();
    }